

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

void phosg::print_data(FILE *stream,iovec *iovs,size_t num_iovs,uint64_t start_address,
                      iovec *prev_iovs,size_t num_prev_iovs,uint64_t flags)

{
  int iVar1;
  FILE *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_58 = stream;
  if ((flags & 0x81) == 0) {
    iVar1 = fileno((FILE *)stream);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) {
      flags = flags | 0x80;
    }
    else {
      flags = flags | 1;
    }
  }
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = &local_58;
  local_38 = ::std::
             _Function_handler<void_(const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Strings.cc:833:21)>
             ::_M_invoke;
  local_40 = ::std::
             _Function_handler<void_(const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Strings.cc:833:21)>
             ::_M_manager;
  format_data((function<void_(const_void_*,_unsigned_long)> *)&local_50,iovs,num_iovs,start_address,
              prev_iovs,num_prev_iovs,flags);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return;
}

Assistant:

void print_data(
    FILE* stream,
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  if (!(flags & (PrintDataFlags::USE_COLOR | PrintDataFlags::DISABLE_COLOR))) {
    if (isatty(fileno(stream))) {
      flags |= PrintDataFlags::USE_COLOR;
    } else {
      flags |= PrintDataFlags::DISABLE_COLOR;
    }
  }
  auto write_data = [&](const void* data, size_t size) -> void {
    fwrite(data, size, 1, stream);
  };
  format_data(write_data, iovs, num_iovs, start_address, prev_iovs, num_prev_iovs, flags);
}